

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

xmlEntityPtr getParameterEntitySplit(void *ctx,xmlChar *name)

{
  code *UNRECOVERED_JUMPTABLE;
  xmlEntityPtr pxVar1;
  xmlSchemaSAXPlugPtr ctxt;
  
  if (((ctx != (void *)0x0) && (*(long *)((long)ctx + 0x10) != 0)) &&
     (UNRECOVERED_JUMPTABLE = *(code **)(*(long *)((long)ctx + 0x10) + 0xc0),
     UNRECOVERED_JUMPTABLE != (code *)0x0)) {
    pxVar1 = (xmlEntityPtr)(*UNRECOVERED_JUMPTABLE)(*(undefined8 *)((long)ctx + 0x20));
    return pxVar1;
  }
  return (xmlEntityPtr)0x0;
}

Assistant:

static xmlEntityPtr
getParameterEntitySplit(void *ctx, const xmlChar *name)
{
    xmlSchemaSAXPlugPtr ctxt = (xmlSchemaSAXPlugPtr) ctx;
    if ((ctxt != NULL) && (ctxt->user_sax != NULL) &&
        (ctxt->user_sax->getParameterEntity != NULL))
	return(ctxt->user_sax->getParameterEntity(ctxt->user_data, name));
    return(NULL);
}